

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallInfo.cpp
# Opt level: O1

ArgSlot Js::CallInfo::GetArgCountWithoutExtraArgs(CallFlags flags,ArgSlot count)

{
  bool bVar1;
  
  bVar1 = HasExtraArg(flags);
  if (bVar1) {
    if (count == 0) {
      ::Math::DefaultOverflowPolicy();
    }
    count = count - 1;
  }
  return count;
}

Assistant:

ArgSlot CallInfo::GetArgCountWithoutExtraArgs(CallFlags flags, ArgSlot count)
    {
        ArgSlot newCount = count;
        if (CallInfo::HasExtraArg(flags))
        {
            if (count == 0)
            {
                ::Math::DefaultOverflowPolicy();
            }
            newCount = count - 1;
        }
        return newCount;
    }